

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

void Assimp::GeometryHelper_Extrusion_CurveIsClosed<aiVector3t<float>>
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pCurve,
               bool pDropTail,bool pRemoveLastPoint,bool *pCurveIsClosed)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_78;
  const_iterator local_70;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_68;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_60;
  const_iterator local_58;
  ulong local_50;
  size_t b2;
  size_t b1;
  size_type sStack_38;
  bool found;
  size_t s_e;
  size_t s;
  size_t cur_sz;
  bool *pCurveIsClosed_local;
  bool pRemoveLastPoint_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvStack_10;
  bool pDropTail_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pCurve_local;
  
  cur_sz = (size_t)pCurveIsClosed;
  pCurveIsClosed_local._6_1_ = pRemoveLastPoint;
  pCurveIsClosed_local._7_1_ = pDropTail;
  pvStack_10 = pCurve;
  sStack_38 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(pCurve);
  *(undefined1 *)cur_sz = 0;
  if (3 < sStack_38) {
    s = sStack_38;
    for (s_e = 3; s_e < sStack_38; s_e = s_e + 1) {
      pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pvStack_10,0);
      pvVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (pvStack_10,s_e);
      bVar1 = aiVector3t<float>::operator==(pvVar2,pvVar3);
      if (bVar1) {
        b1._7_1_ = 1;
        b2 = 1;
        local_50 = s_e;
        while (local_50 = local_50 + 1, local_50 < s) {
          pvVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             (pvStack_10,b2);
          pvVar3 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                             (pvStack_10,local_50);
          bVar1 = aiVector3t<float>::operator!=(pvVar2,pvVar3);
          if (bVar1) {
            b1._7_1_ = 0;
            break;
          }
          b2 = b2 + 1;
        }
        this = pvStack_10;
        if ((b1._7_1_ & 1) != 0) {
          *(undefined1 *)cur_sz = 1;
          if ((pCurveIsClosed_local._7_1_ & 1) == 0) {
            return;
          }
          if ((pCurveIsClosed_local._6_1_ & 1) == 0) {
            s_e = s_e + 1;
          }
          local_68._M_current =
               (aiVector3t<float> *)
               std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                         (pvStack_10);
          local_60 = __gnu_cxx::
                     __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                     ::operator+(&local_68,s_e);
          __gnu_cxx::
          __normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
          ::__normal_iterator<aiVector3t<float>*>
                    ((__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
                      *)&local_58,&local_60);
          local_78._M_current =
               (aiVector3t<float> *)
               std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end(pvStack_10);
          __gnu_cxx::
          __normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
          ::__normal_iterator<aiVector3t<float>*>
                    ((__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
                      *)&local_70,&local_78);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::erase
                    (this,local_58,local_70);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void GeometryHelper_Extrusion_CurveIsClosed(std::vector<TVector>& pCurve, const bool pDropTail, const bool pRemoveLastPoint, bool& pCurveIsClosed)
{
    size_t cur_sz = pCurve.size();

	pCurveIsClosed = false;
	// for curve with less than four points checking is have no sense,
	if(cur_sz < 4) return;

	for(size_t s = 3, s_e = cur_sz; s < s_e; s++)
	{
		// search for first point of duplicated part.
		if(pCurve[0] == pCurve[s])
		{
			bool found = true;

			// check if tail(indexed by b2) is duplicate of head(indexed by b1).
			for(size_t b1 = 1, b2 = (s + 1); b2 < cur_sz; b1++, b2++)
			{
				if(pCurve[b1] != pCurve[b2])
				{// points not match: clear flag and break loop.
					found = false;

					break;
				}
			}// for(size_t b1 = 1, b2 = (s + 1); b2 < cur_sz; b1++, b2++)

			// if duplicate tail is found then drop or not it depending on flags.
			if(found)
			{
				pCurveIsClosed = true;
				if(pDropTail)
				{
					if(!pRemoveLastPoint) s++;// prepare value for iterator's arithmetics.

					pCurve.erase(pCurve.begin() + s, pCurve.end());// remove tail
				}

				break;
			}// if(found)
		}// if(pCurve[0] == pCurve[s])
	}// for(size_t s = 3, s_e = (cur_sz - 1); s < s_e; s++)
}